

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgGoogol.cpp
# Opt level: O3

dgGoogol * __thiscall
dgGoogol::operator+(dgGoogol *__return_storage_ptr__,dgGoogol *this,dgGoogol *A)

{
  ulong *puVar1;
  ulong *puVar2;
  short sVar3;
  HaI8 HVar4;
  HaI32 HVar5;
  HaU64 carrier_1;
  HaU64 carrier;
  long lVar6;
  ulong uVar7;
  int bits;
  long lVar8;
  ulong uVar9;
  short sVar10;
  HaU64 HVar11;
  dgGoogol *this_00;
  bool bVar12;
  undefined8 uVar13;
  HaU64 HVar14;
  HaU64 HVar15;
  HaU64 mantissa [4];
  HaU64 mantissa1 [4];
  HaU64 mantissa0 [4];
  HaU64 local_88 [4];
  HaU64 local_68 [4];
  HaU64 local_48 [4];
  
  this_00 = __return_storage_ptr__;
  dgGoogol(__return_storage_ptr__);
  if (A->m_mantissa[0] == 0 || this->m_mantissa[0] == 0) {
    if (A->m_mantissa[0] == 0) {
      __return_storage_ptr__->m_mantissa[3] = this->m_mantissa[3];
      uVar13._0_1_ = this->m_sign;
      uVar13._1_1_ = this->field_0x1;
      uVar13._2_2_ = this->m_exponent;
      uVar13._4_4_ = *(undefined4 *)&this->field_0x4;
      HVar11 = this->m_mantissa[0];
      HVar14 = this->m_mantissa[1];
      HVar15 = this->m_mantissa[2];
    }
    else {
      __return_storage_ptr__->m_mantissa[3] = A->m_mantissa[3];
      uVar13._0_1_ = A->m_sign;
      uVar13._1_1_ = A->field_0x1;
      uVar13._2_2_ = A->m_exponent;
      uVar13._4_4_ = *(undefined4 *)&A->field_0x4;
      HVar11 = A->m_mantissa[0];
      HVar14 = A->m_mantissa[1];
      HVar15 = A->m_mantissa[2];
    }
    __return_storage_ptr__->m_sign = (char)uVar13;
    __return_storage_ptr__->field_0x1 = (char)((ulong)uVar13 >> 8);
    __return_storage_ptr__->m_exponent = (short)((ulong)uVar13 >> 0x10);
    *(int *)&__return_storage_ptr__->field_0x4 = (int)((ulong)uVar13 >> 0x20);
    __return_storage_ptr__->m_mantissa[0] = HVar11;
    __return_storage_ptr__->m_mantissa[1] = HVar14;
    __return_storage_ptr__->m_mantissa[2] = HVar15;
  }
  else {
    local_48[0] = this->m_mantissa[0];
    local_48[1] = this->m_mantissa[1];
    local_48[2] = this->m_mantissa[2];
    local_48[3] = this->m_mantissa[3];
    if (this->m_sign != '\0') {
      lVar6 = 1;
      lVar8 = 3;
      do {
        this_00 = (dgGoogol *)(~local_48[lVar8] + lVar6);
        if (this_00 != (dgGoogol *)0x0) {
          lVar6 = 0;
        }
        local_48[lVar8] = (HaU64)this_00;
        bVar12 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar12);
    }
    local_68[0] = A->m_mantissa[0];
    local_68[1] = A->m_mantissa[1];
    local_68[2] = A->m_mantissa[2];
    local_68[3] = A->m_mantissa[3];
    if (A->m_sign != '\0') {
      lVar6 = 1;
      lVar8 = 3;
      do {
        HVar11 = ~local_68[lVar8] + lVar6;
        if (HVar11 != 0) {
          lVar6 = 0;
        }
        local_68[lVar8] = HVar11;
        bVar12 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar12);
    }
    sVar10 = this->m_exponent;
    sVar3 = A->m_exponent;
    bits = (int)sVar10 - (int)sVar3;
    if (bits == 0 || (int)sVar10 < (int)sVar3) {
      if (bits < 0) {
        ShiftRightMantissa(this_00,local_48,-bits);
        sVar10 = sVar3;
      }
    }
    else {
      ShiftRightMantissa(this_00,local_68,bits);
    }
    lVar6 = 3;
    uVar7 = 0;
    do {
      puVar1 = local_68 + lVar6;
      puVar2 = local_48 + lVar6;
      uVar9 = *puVar1 + *puVar2;
      local_88[lVar6] = uVar9 + uVar7;
      bVar12 = lVar6 != 0;
      lVar6 = lVar6 + -1;
      uVar7 = (ulong)(CARRY8(uVar9,uVar7) || CARRY8(*puVar1,*puVar2));
    } while (bVar12);
    HVar4 = '\0';
    if ((long)local_88[0] < 0) {
      lVar6 = 1;
      lVar8 = 3;
      do {
        HVar11 = ~local_88[lVar8] + lVar6;
        if (HVar11 != 0) {
          lVar6 = 0;
        }
        local_88[lVar8] = HVar11;
        bVar12 = lVar8 != 0;
        lVar8 = lVar8 + -1;
      } while (bVar12);
      HVar4 = '\x01';
    }
    HVar5 = NormalizeMantissa(this_00,local_88);
    sVar10 = sVar10 + (short)HVar5;
    if (HVar5 < -0xff) {
      HVar4 = '\0';
      sVar10 = 0;
    }
    __return_storage_ptr__->m_sign = HVar4;
    __return_storage_ptr__->m_exponent = sVar10;
    __return_storage_ptr__->m_mantissa[0] = local_88[0];
    __return_storage_ptr__->m_mantissa[1] = local_88[1];
    __return_storage_ptr__->m_mantissa[2] = local_88[2];
    __return_storage_ptr__->m_mantissa[3] = local_88[3];
  }
  return __return_storage_ptr__;
}

Assistant:

dgGoogol dgGoogol::operator+ (const dgGoogol &A) const
{
	dgGoogol tmp;
	if (m_mantissa[0] && A.m_mantissa[0]) {
		hacd::HaU64 mantissa0[DG_GOOGOL_SIZE];
		hacd::HaU64 mantissa1[DG_GOOGOL_SIZE];
		hacd::HaU64 mantissa[DG_GOOGOL_SIZE];

		CopySignedMantissa (mantissa0);
		A.CopySignedMantissa (mantissa1);

		hacd::HaI32 exponetDiff = m_exponent - A.m_exponent;
		hacd::HaI32 exponent = m_exponent;
		if (exponetDiff > 0) {
			ShiftRightMantissa (mantissa1, exponetDiff);
		} else if (exponetDiff < 0) {
			exponent = A.m_exponent;
			ShiftRightMantissa (mantissa0, -exponetDiff);
		} 

		hacd::HaU64 carrier = 0;
		for (hacd::HaI32 i = DG_GOOGOL_SIZE - 1; i >= 0; i --) {
			hacd::HaU64 m0 = mantissa0[i];
			hacd::HaU64 m1 = mantissa1[i];
			mantissa[i] = m0 + m1 + carrier;
			carrier = CheckCarrier (m0, m1) | CheckCarrier (m0 + m1, carrier);
		}

		hacd::HaI8 sign = 0;
		if (hacd::HaI64 (mantissa[0]) < 0) {
			sign = 1;
			NegateMantissa (mantissa);
		}

		hacd::HaI32 bits = NormalizeMantissa (mantissa);
		if (bits <= (-64 * DG_GOOGOL_SIZE)) {
			tmp.m_sign = 0;
			tmp.m_exponent = 0;
		} else {
			tmp.m_sign = sign;
			tmp.m_exponent =  hacd::HaI16 (exponent + bits);
		}

		memcpy (tmp.m_mantissa, mantissa, sizeof (m_mantissa));
		

	} else if (A.m_mantissa[0]) {
		tmp = A;
	} else {
		tmp = *this;
	}

	return tmp;
}